

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deque.hpp
# Opt level: O0

void * __thiscall
ft::deque<int,_ft::allocator<int>_>::realloc
          (deque<int,_ft::allocator<int>_> *this,void *__ptr,size_t __size)

{
  size_type rhs;
  void *extraout_RAX;
  dequeIterator<int,_64UL> local_a0;
  ulong local_78;
  size_type i_1;
  pointer p;
  size_type i;
  map_pointer tmp;
  size_type offset;
  map_pointer old_finish;
  map_pointer old_start;
  map_pointer tmp_start;
  pointer local_28;
  map_pointer newMap;
  size_type newMapSize;
  deque<int,_ft::allocator<int>_> *pdStack_10;
  chunk_allocator chunk_alloc;
  deque<int,_ft::allocator<int>_> *this_local;
  
  pdStack_10 = this;
  allocator<int_*>::allocator((allocator<int_*> *)((long)&newMapSize + 7));
  newMap = (map_pointer)(this->m_map_size + 4);
  local_28 = allocator<int_*>::allocate
                       ((allocator<int_*> *)((long)&newMapSize + 7),(size_type)newMap);
  old_start = local_28 + ((long)newMap - this->m_chunks >> 1);
  i = (size_type)(this->m_start).m_node;
  offset = (size_type)(this->m_finish).m_node;
  tmp = (map_pointer)((long)(offset - i) >> 3);
  old_finish = (map_pointer)i;
  for (p = (pointer)0x0; p < newMap; p = (pointer)((long)p + 1)) {
    i_1 = 0;
    if ((old_start <= local_28 + (long)p) && (local_28 + (long)p <= old_start + (long)tmp)) {
      i_1 = *(size_type *)i;
      i = i + 8;
    }
    allocator<int_*>::construct
              ((allocator<int_*> *)((long)&newMapSize + 7),local_28 + (long)p,(const_reference)&i_1)
    ;
  }
  for (local_78 = 0; local_78 < this->m_map_size; local_78 = local_78 + 1) {
    allocator<int_*>::destroy((allocator<int_*> *)((long)&newMapSize + 7),this->m_map + local_78);
  }
  allocator<int_*>::deallocate
            ((allocator<int_*> *)((long)&newMapSize + 7),this->m_map,this->m_map_size);
  this->m_map = local_28;
  this->m_map_size = (size_type)newMap;
  tmp = (map_pointer)((long)(this->m_start).m_cur - (long)(this->m_start).m_first >> 2);
  dequeIterator<int,_64UL>::setNode(&this->m_start,old_start);
  (this->m_start).m_cur = (this->m_start).m_first + (long)tmp;
  rhs = size(this);
  dequeIterator<int,_64UL>::operator+(&local_a0,&this->m_start,rhs);
  dequeIterator<int,_64UL>::operator=(&this->m_finish,&local_a0);
  dequeIterator<int,_64UL>::~dequeIterator(&local_a0);
  allocator<int_*>::~allocator((allocator<int_*> *)((long)&newMapSize + 7));
  return extraout_RAX;
}

Assistant:

void	realloc() {
		chunk_allocator	chunk_alloc;

		size_type	newMapSize = this->m_map_size + 4;
		map_pointer	newMap = chunk_alloc.allocate(newMapSize);

		map_pointer	tmp_start = newMap + ((newMapSize - this->m_chunks) / 2);

		map_pointer	old_start = this->m_start.m_node;
		map_pointer	old_finish = this->m_finish.m_node;

		size_type	offset = old_finish - old_start;

		map_pointer	tmp = old_start;
		for (size_type i = 0; i < newMapSize; ++i) {
			pointer p = NULL;
			if (newMap + i >= tmp_start && newMap + i <= tmp_start + offset) {
				p = *tmp;
				++tmp;
			}
			chunk_alloc.construct(newMap + i, p);
		}

		for (size_type i = 0; i < this->m_map_size; ++i)
			chunk_alloc.destroy(this->m_map + i);
		chunk_alloc.deallocate(this->m_map, this->m_map_size);

		this->m_map = newMap;
		this->m_map_size = newMapSize;

		offset = this->m_start.m_cur - this->m_start.m_first;

		this->m_start.setNode(tmp_start);
		this->m_start.m_cur = this->m_start.m_first + offset;

		this->m_finish = this->m_start + this->size();
	}